

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O2

size_t write_str_tag(MIR_context_t ctx,writer_func_t writer,MIR_str_t str,bin_tag_t start_tag)

{
  HTAB_string_t **str_tab;
  int iVar1;
  size_t sVar2;
  MIR_str_t str_00;
  string_t string;
  string_t local_38;
  
  str_tab = &ctx->io_ctx->output_string_tab;
  if (writer == (writer_func_t)0x0) {
    string_store(&local_38,ctx,&ctx->io_ctx->output_strings,str_tab,str);
    sVar2 = 0;
  }
  else {
    str_00.s = (char *)&local_38;
    str_00.len = (size_t)str.s;
    iVar1 = string_find((VARR_string_t **)str_tab,(HTAB_string_t **)str.len,str_00,
                        (string_t *)str.len);
    if ((iVar1 == 0) || (local_38.num == 0)) {
      __assert_fail("ok_p && string.num >= 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                    ,0x12ba,
                    "size_t write_str_tag(MIR_context_t, writer_func_t, MIR_str_t, bin_tag_t)");
    }
    sVar2 = uint_length(local_38.num - 1);
    if (4 < sVar2) {
      __assert_fail("nb <= 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                    ,0x12bc,
                    "size_t write_str_tag(MIR_context_t, writer_func_t, MIR_str_t, bin_tag_t)");
    }
    iVar1 = (int)sVar2 + (uint)(sVar2 == 0);
    put_byte(ctx,writer,(start_tag - TAG_U1) + iVar1);
    sVar2 = put_uint(ctx,writer,local_38.num - 1,iVar1);
    sVar2 = sVar2 + 1;
  }
  return sVar2;
}

Assistant:

static size_t write_str_tag (MIR_context_t ctx, writer_func_t writer, MIR_str_t str,
                             bin_tag_t start_tag) {
  size_t nb;
  int ok_p;
  string_t string;

  if (writer == NULL) {
    string_store (ctx, &output_strings, &output_string_tab, str);
    return 0;
  }
  ok_p = string_find (&output_strings, &output_string_tab, str, &string);
  mir_assert (ok_p && string.num >= 1);
  nb = uint_length (string.num - 1);
  mir_assert (nb <= 4);
  if (nb == 0) nb = 1;
  put_byte (ctx, writer, start_tag + (int) nb - 1);
  return put_uint (ctx, writer, string.num - 1, (int) nb) + 1;
}